

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O3

ON_SubDVertex * __thiscall
ON_SubDSectorIterator::Initialize
          (ON_SubDSectorIterator *this,ON_SubDFace *initial_face,ON__UINT_PTR iterator_orientation,
          ON_SubDVertex *center_vertex)

{
  uint face_vertex_index;
  ON_SubDVertex *pOVar1;
  ON_SubDEdgePtr *pOVar2;
  ulong uVar3;
  
  if ((initial_face != (ON_SubDFace *)0x0 && center_vertex != (ON_SubDVertex *)0x0) &&
     (initial_face->m_edge_count != 0)) {
    pOVar2 = initial_face->m_edge4;
    face_vertex_index = 0;
    do {
      if ((face_vertex_index == 4) &&
         (pOVar2 = initial_face->m_edgex, pOVar2 == (ON_SubDEdgePtr *)0x0)) break;
      uVar3 = pOVar2->m_ptr & 0xfffffffffffffff8;
      if ((uVar3 != 0) &&
         (*(ON_SubDVertex **)(uVar3 + 0x80 + (ulong)((uint)pOVar2->m_ptr & 1) * 8) == center_vertex)
         ) {
        pOVar1 = Initialize(this,initial_face,iterator_orientation,face_vertex_index);
        return pOVar1;
      }
      face_vertex_index = face_vertex_index + 1;
      pOVar2 = pOVar2 + 1;
    } while (initial_face->m_edge_count != face_vertex_index);
  }
  this->m_current_fei[0] = 0;
  this->m_current_fei[1] = 0;
  this->m_initial_face_dir = 0;
  this->m_current_face_dir = 0;
  this->m_current_eptr[1].m_ptr = 0;
  this->m_initial_fvi = 0;
  this->m_current_fvi = 0;
  this->m_current_face = (ON_SubDFace *)0x0;
  this->m_current_eptr[0].m_ptr = 0;
  this->m_center_vertex = (ON_SubDVertex *)0x0;
  this->m_initial_face = (ON_SubDFace *)0x0;
  *(undefined8 *)&this->m_current_ring_index = 0;
  this->m_current_eptr[0].m_ptr = 0;
  this->m_current_eptr[1].m_ptr = 0;
  ON_SubDIncrementErrorCount();
  return (ON_SubDVertex *)0x0;
}

Assistant:

const ON_SubDVertex* ON_SubDSectorIterator::Initialize(
  const ON_SubDFace* initial_face,
  ON__UINT_PTR iterator_orientation,
  const ON_SubDVertex* center_vertex
  )
{
  if (nullptr != center_vertex && nullptr != initial_face)
  {
    ON__UINT_PTR eptr;
    const ON_SubDEdge* edge;
    const unsigned int edge_count = initial_face->m_edge_count;
    const ON_SubDEdgePtr* face_eptr = initial_face->m_edge4;
    for (unsigned int efi = 0; efi < edge_count; efi++, face_eptr++)
    {
      if (4 == efi)
      {
        face_eptr = initial_face->m_edgex;
        if (nullptr == face_eptr)
          break;
      }
      eptr = face_eptr->m_ptr;
      edge = ON_SUBD_EDGE_POINTER(eptr);
      if (nullptr == edge)
        continue;
      eptr = ON_SUBD_EDGE_DIRECTION(eptr);
      if (center_vertex == edge->m_vertex[eptr])
        return Initialize(initial_face, iterator_orientation, efi);
    }
  }

  Initialize();
  return ON_SUBD_RETURN_ERROR(nullptr);
}